

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  AtomicDouble *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PixelSensor *this_00;
  Pixel *pPVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar11;
  float *__result;
  Tuple2<pbrt::Point2,_float> *pTVar12;
  double dVar13;
  double dVar14;
  long lVar15;
  GaussianFilter *this_01;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 unaff_R15;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  Float FVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [56];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  RGB RVar40;
  SampledSpectrum H;
  Tuple2<pbrt::Point2,_float> local_b0;
  float local_a8;
  float local_a0;
  uint local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [4];
  float afStack_64 [3];
  undefined1 local_58 [16];
  SampledSpectrum local_48;
  
  auVar37._8_56_ = L._16_56_;
  auVar37._0_8_ = L.values.values._8_8_;
  auVar36._8_56_ = L._8_56_;
  auVar36._0_8_ = L.values.values._0_8_;
  _local_68 = vmovlhps_avx(auVar36._0_16_,auVar37._0_16_);
  if (!NAN((float)local_68)) {
    uVar17 = 0;
    do {
      uVar19 = uVar17;
      if (uVar19 == 3) break;
      uVar17 = uVar19 + 1;
    } while (!NAN(*(float *)(local_68 + uVar19 * 4 + 4)) &&
             !NAN(*(float *)(local_68 + uVar19 * 4 + 4)));
    if (2 < uVar19) {
      this_00 = (this->super_FilmBase).sensor;
      fVar29 = this_00->imagingRatio;
      local_48.values.values[0] = fVar29 * (float)local_68;
      local_48.values.values[1] = fVar29 * afStack_64[0];
      local_48.values.values[2] = fVar29 * afStack_64[1];
      local_48.values.values[3] = fVar29 * afStack_64[2];
      auVar28 = ZEXT856(local_48.values.values._8_8_);
      RVar40 = PixelSensor::ToSensorRGB(this_00,&local_48,lambda);
      fVar29 = RVar40.b;
      auVar39._0_8_ = RVar40._0_8_;
      auVar39._8_56_ = auVar28;
      local_78 = auVar39._0_16_;
      pTVar12 = &local_b0;
      local_b0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_78);
      local_a8 = fVar29;
      lVar15 = 4;
      do {
        if (pTVar12->x < *(float *)((long)&local_b0.x + lVar15)) {
          pTVar12 = (Tuple2<pbrt::Point2,_float> *)((long)&local_b0.x + lVar15);
        }
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0xc);
      if (this->maxComponentValue < pTVar12->x) {
        fVar24 = this->maxComponentValue / pTVar12->x;
        local_48.values.values[1] = fVar24 * local_48.values.values[1];
        local_48.values.values[0] = fVar24 * local_48.values.values[0];
        local_48.values.values[2] = fVar24 * local_48.values.values[2];
        local_48.values.values[3] = fVar24 * local_48.values.values[3];
        local_78._0_4_ = RVar40.r * fVar24;
        local_78._4_4_ = RVar40.g * fVar24;
        local_78._8_4_ = auVar28._0_4_ * fVar24;
        local_78._12_4_ = auVar28._4_4_ * fVar24;
        fVar29 = fVar29 * fVar24;
      }
      auVar36 = ZEXT1664(local_78);
      uVar17 = *(ulong *)((this->super_FilmBase).filter.
                          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                          .bits & 0xffffffffffff);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar17;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar21._8_4_ = 0x3f000000;
      auVar21._0_8_ = 0x3f0000003f000000;
      auVar21._12_4_ = 0x3f000000;
      auVar21 = vaddps_avx512vl(auVar23,auVar21);
      auVar23 = vsubps_avx(auVar21,auVar22);
      auVar26._0_4_ = auVar21._0_4_ + (float)uVar17;
      auVar26._4_4_ = auVar21._4_4_ + (float)(uVar17 >> 0x20);
      auVar26._8_4_ = auVar21._8_4_ + 0.0;
      auVar26._12_4_ = auVar21._12_4_ + 0.0;
      auVar21 = vroundps_avx(auVar26,9);
      auVar22 = vroundps_avx(auVar23,9);
      auVar31._0_4_ = (int)auVar22._0_4_;
      auVar31._4_4_ = (int)auVar22._4_4_;
      auVar31._8_4_ = (int)auVar22._8_4_;
      auVar31._12_4_ = (int)auVar22._12_4_;
      auVar27._0_4_ = (int)auVar21._0_4_;
      auVar27._4_4_ = (int)auVar21._4_4_;
      auVar27._8_4_ = (int)auVar21._8_4_;
      auVar27._12_4_ = (int)auVar21._12_4_;
      auVar21 = vpcmpeqd_avx(auVar23,auVar23);
      auVar22 = vpsubd_avx(auVar27,auVar21);
      auVar21 = vpminsd_avx(auVar22,auVar31);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>;
      local_58 = vpmaxsd_avx(auVar21,auVar35);
      uVar16 = local_58._4_4_;
      auVar21 = vpmaxsd_avx(auVar31,auVar22);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar21 = vpminsd_avx(auVar32,auVar21);
      local_9c = auVar21._4_4_;
      if ((int)auVar21._4_4_ < (int)uVar16) {
        local_9c = uVar16;
      }
      uVar17 = vpcmpd_avx512vl(local_58,auVar21,5);
      if ((uVar17 & 3) == 0) {
        uVar19 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),local_58._0_4_);
        uVar17 = (ulong)uVar16 << 0x20 | uVar19;
        local_88 = vmovshdup_avx(local_78);
        auVar37 = ZEXT1664(local_88);
        auVar39 = ZEXT1664(local_58);
        do {
          local_98 = auVar39._0_16_;
          auVar22 = vcvtdq2ps_avx(local_98);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
          auVar22 = vsubps_avx(auVar33,auVar22);
          auVar7._8_4_ = 0xbf000000;
          auVar7._0_8_ = 0xbf000000bf000000;
          auVar7._12_4_ = 0xbf000000;
          auVar22 = vaddps_avx512vl(auVar22,auVar7);
          local_b0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar22);
          uVar18 = (this->super_FilmBase).filter.
                   super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   .bits;
          this_01 = (GaussianFilter *)(uVar18 & 0xffffffffffff);
          sVar11 = (short)(uVar18 >> 0x30);
          if (uVar18 >> 0x30 < 3) {
            if (sVar11 == 2) {
              fVar24 = GaussianFilter::Evaluate(this_01,(Point2f *)&local_b0);
LAB_003f022e:
              auVar39 = ZEXT1664(local_98);
              auVar37 = ZEXT1664(local_88);
              auVar36 = ZEXT1664(local_78);
            }
            else {
              auVar8._8_4_ = 0x7fffffff;
              auVar8._0_8_ = 0x7fffffff7fffffff;
              auVar8._12_4_ = 0x7fffffff;
              auVar23 = vandps_avx512vl(auVar22,auVar8);
              fVar24 = 0.0;
              if (auVar23._0_4_ <= (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
                auVar22 = vmovshdup_avx(auVar22);
                auVar9._8_4_ = 0x7fffffff;
                auVar9._0_8_ = 0x7fffffff7fffffff;
                auVar9._12_4_ = 0x7fffffff;
                auVar22 = vandps_avx512vl(auVar22,auVar9);
                uVar6 = vcmpss_avx512f(auVar22,ZEXT416((uint)(this_01->radius).
                                                             super_Tuple2<pbrt::Vector2,_float>.y),2
                                      );
                fVar24 = (float)((uint)((byte)uVar6 & 1) * 0x3f800000);
              }
            }
          }
          else {
            if (uVar18 >> 0x30 == 4) {
              fVar24 = LanczosSincFilter::Evaluate
                                 ((LanczosSincFilter *)this_01,(Point2f *)&local_b0);
              goto LAB_003f022e;
            }
            if (sVar11 == 3) {
              local_a0 = MitchellFilter::Mitchell1D
                                   ((MitchellFilter *)this_01,
                                    auVar22._0_4_ /
                                    (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x);
              FVar25 = MitchellFilter::Mitchell1D
                                 ((MitchellFilter *)this_01,
                                  local_b0.y /
                                  (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.y);
              auVar39 = ZEXT1664(local_98);
              auVar37 = ZEXT1664(local_88);
              auVar36 = ZEXT1664(local_78);
              fVar24 = FVar25 * local_a0;
            }
            else {
              auVar10._8_4_ = 0x7fffffff;
              auVar10._0_8_ = 0x7fffffff7fffffff;
              auVar10._12_4_ = 0x7fffffff;
              auVar22 = vandps_avx512vl(auVar22,auVar10);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>;
              auVar22 = vsubps_avx(auVar34,auVar22);
              auVar22 = vmaxps_avx(auVar22,_DAT_0045e4a0);
              auVar23 = vmovshdup_avx(auVar22);
              fVar24 = auVar22._0_4_ * auVar23._0_4_;
            }
          }
          if ((fVar24 != 0.0) || (NAN(fVar24))) {
            iVar2 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
            iVar3 = (this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
            iVar4 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
            pPVar5 = (this->pixels).values;
            lVar15 = 0;
            do {
              fVar30 = auVar36._0_4_;
              if (((int)lVar15 != 0) && (fVar30 = auVar37._0_4_, (int)lVar15 != 1)) {
                fVar30 = fVar29;
              }
              pAVar1 = pPVar5[(iVar3 - iVar2) * ((int)(uVar17 >> 0x20) - iVar4) +
                              ((int)uVar17 - iVar2)].splatRGB + lVar15;
              dVar13 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
              do {
                LOCK();
                dVar14 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                bVar20 = dVar13 == dVar14;
                if (bVar20) {
                  (pAVar1->bits).super___atomic_base<unsigned_long>._M_i =
                       (__int_type_conflict)((double)(fVar24 * fVar30) + dVar13);
                  dVar14 = dVar13;
                }
                UNLOCK();
                dVar13 = dVar14;
              } while (!bVar20);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
          }
          uVar16 = auVar39._0_4_ + 1;
          uVar18 = uVar17 & 0xffffffff00000000;
          uVar17 = uVar18 + uVar19 + 0x100000000;
          if (uVar16 != auVar21._0_4_) {
            uVar17 = uVar18 | uVar16;
          }
          auVar39 = ZEXT864(uVar17);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar17;
          uVar18 = vpcmpd_avx512vl(auVar38,local_58,4);
        } while (((uVar18 & 1) != 0) || (local_9c != (uint)(uVar17 >> 0x20)));
      }
      return;
    }
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x1ff,"Check failed: %s",(char (*) [13])"!L.HasNaNs()");
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    SampledSpectrum H = L * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        H *= maxComponentValue / m;
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}